

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O2

_Bool option_set(char *name,int val)

{
  player *ppVar1;
  int iVar2;
  option_entry *poVar3;
  size_t opt;
  ulong uVar4;
  
  poVar3 = options;
  uVar4 = 0;
  do {
    if (uVar4 == 0x2d) {
LAB_00193c31:
      return uVar4 < 0x2d;
    }
    if (poVar3->name != (char *)0x0) {
      iVar2 = strcmp(poVar3->name,name);
      ppVar1 = player;
      if (iVar2 == 0) {
        (player->opts).opt[uVar4] = val != 0;
        if ((val != 0) && ((0x15400000UL >> (uVar4 & 0x3f) & 1) != 0)) {
          (ppVar1->opts).opt[uVar4 + 1] = true;
        }
        goto LAB_00193c31;
      }
    }
    uVar4 = uVar4 + 1;
    poVar3 = poVar3 + 1;
  } while( true );
}

Assistant:

bool option_set(const char *name, int val)
{
	size_t opt;

	/* Try normal options first */
	for (opt = 0; opt < OPT_MAX; opt++) {
		if (!options[opt].name || !streq(options[opt].name, name))
			continue;

		player->opts.opt[opt] = val ? true : false;
		if (val && option_is_cheat(opt))
			player->opts.opt[opt + 1] = true;

		return true;
	}

	return false;
}